

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::EndModule(SharedValidator *this)

{
  bool bVar1;
  reference rhs;
  Var local_c8;
  Enum local_7c;
  undefined1 local_78 [8];
  Var func_var;
  iterator __end1;
  iterator __begin1;
  vector<wabt::Var,_std::allocator<wabt::Var>_> *__range1;
  SharedValidator *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  __end1 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::begin(&this->init_expr_funcs_);
  func_var.field_2._24_8_ =
       std::vector<wabt::Var,_std::allocator<wabt::Var>_>::end(&this->init_expr_funcs_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                                *)((long)&func_var.field_2 + 0x18));
    if (!bVar1) break;
    rhs = __gnu_cxx::
          __normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
          operator*(&__end1);
    Var::Var((Var *)local_78,rhs);
    Var::Var(&local_c8,(Var *)local_78);
    local_7c = (Enum)CheckDeclaredFunc(this,&local_c8);
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_7c);
    Var::~Var(&local_c8);
    Var::~Var((Var *)local_78);
    __gnu_cxx::__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
    operator++(&__end1);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::EndModule() {
  // Verify that any ref.func used in init expressions for globals are
  // mentioned in an elems section.  This can't be done while process the
  // globals because the global section comes before the elem section.
  Result result = Result::Ok;
  for (Var func_var : init_expr_funcs_) {
    result |= CheckDeclaredFunc(func_var);
  }
  return result;
}